

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool lexer_CaptureRept(CaptureBody *capture)

{
  LexerState *pLVar1;
  bool bVar2;
  int c;
  int iVar3;
  long lVar4;
  
  startCapture(capture);
  if (lexerState->atLineStart != true) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9ba,"lexer_CaptureRept");
  }
  lVar4 = 0;
  do {
    pLVar1 = lexerState;
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar1->colNo = 1;
    do {
      do {
        c = nextChar();
      } while (c == 9);
    } while (c == 0x20);
    bVar2 = startsIdentifier(c);
    if (bVar2) {
      iVar3 = readIdentifier((char)c);
      if (iVar3 - 0x73U < 2) {
        lVar4 = lVar4 + 1;
      }
      else if (iVar3 == 0x7b) {
        if (lVar4 == 0) {
          lexerState->captureSize = lexerState->captureSize - 4;
          bVar2 = c != -1;
LAB_0010cf7f:
          endCapture(capture);
          lexerState->atLineStart = false;
          return bVar2;
        }
        lVar4 = lVar4 + -1;
      }
    }
    while ((c != 0xd && (c != 10))) {
      if (c == -1) {
        bVar2 = false;
        error("Unterminated REPT/FOR block\n");
        goto LAB_0010cf7f;
      }
      c = nextChar();
    }
    handleCRLF(c);
  } while( true );
}

Assistant:

bool lexer_CaptureRept(struct CaptureBody *capture)
{
	startCapture(capture);

	size_t depth = 0;
	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match a `REPT` or `ENDR` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `REPT`, `FOR` or `ENDR` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_REPT:
			case T_POP_FOR:
				depth++;
				// Ignore the rest of that line
				break;

			case T_POP_ENDR:
				if (!depth) {
					// The final ENDR has been captured, but we don't want it!
					// We know we have read exactly "ENDR", not e.g. an EQUS
					lexerState->captureSize -= strlen("ENDR");
					goto finish;
				}
				depth--;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated REPT/FOR block\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDR or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDR terminated the block, false if it reached EOF first
	return c != EOF;
}